

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextIO.cpp
# Opt level: O3

iterator AddLogMsg(char *szPath,int ln,char *szFunc,logLevelTy lvl,char *szMsg,__va_list_tag *args)

{
  _List_node_base *p_Var1;
  int iVar2;
  char *pcVar3;
  _Node *p_Var4;
  pthread_t pVar5;
  logLevelTy local_38;
  int local_34;
  char *local_30;
  char *local_28;
  char *local_20;
  
  local_38 = lvl;
  local_34 = ln;
  local_28 = szFunc;
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&gLogMutex);
  if (iVar2 == 0) {
    pcVar3 = strrchr(szPath,0x2f);
    local_30 = pcVar3 + 1;
    if (pcVar3 == (char *)0x0) {
      local_30 = szPath;
    }
    if (args != (__va_list_tag *)0x0) {
      vsnprintf(gBuf,0xfd0,szMsg,args);
      szMsg = gBuf;
    }
    local_20 = szMsg;
    p_Var4 = std::__cxx11::list<LogMsgTy,std::allocator<LogMsgTy>>::
             _M_create_node<char_const*&,int&,char_const*&,logLevelTy&,char_const*>
                       ((list<LogMsgTy,std::allocator<LogMsgTy>> *)&gLog_abi_cxx11_,&local_30,
                        &local_34,&local_28,&local_38,&local_20);
    std::__detail::_List_node_base::_M_hook(&p_Var4->super__List_node_base);
    gLog_abi_cxx11_.super__List_base<LogMsgTy,_std::allocator<LogMsgTy>_>._M_impl._M_node._M_size =
         gLog_abi_cxx11_.super__List_base<LogMsgTy,_std::allocator<LogMsgTy>_>._M_impl._M_node.
         _M_size + 1;
    pVar5 = pthread_self();
    if (pVar5 == dataRefs.xpThread._M_thread) {
      FlushMsg();
    }
    p_Var1 = gLog_abi_cxx11_.super__List_base<LogMsgTy,_std::allocator<LogMsgTy>_>._M_impl._M_node.
             super__List_node_base._M_next;
    pthread_mutex_unlock((pthread_mutex_t *)&gLogMutex);
    return (iterator)p_Var1;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

LogMsgListTy::iterator AddLogMsg (const char* szPath, int ln, const char* szFunc,
                                  logLevelTy lvl, const char* szMsg, va_list args)
{
    // We get the lock already to avoid having to lock twice if in main thread
    std::lock_guard<std::recursive_mutex> lock(gLogMutex);
    
    // Cut off path from file name
    const char* szFile = strrchr(szPath, PATH_DELIM);  // extract file from path
    if (!szFile) szFile = szPath; else szFile++;

    // Prepare the formatted string if variable arguments are given
    if (args)
        vsnprintf(gBuf, sizeof(gBuf), szMsg, args);

    // Add the list entry
    gLog.emplace_front(szFile, ln, szFunc, lvl,
                       args ? gBuf : szMsg);

    // Flush immediately if called from main thread
    if (dataRefs.IsXPThread())
        FlushMsg();
    
    // was added to the front
    return gLog.begin();
}